

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_connecter.cpp
# Opt level: O0

int __thiscall
zmq::tcp_connecter_t::connect(tcp_connecter_t *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  bool bVar4;
  fd_t result;
  char *errstr;
  int rc;
  socklen_t len;
  int err;
  socklen_t local_18;
  int local_14;
  tcp_connecter_t *local_10;
  int local_4;
  
  local_14 = 0;
  local_18 = 4;
  local_10 = this;
  iVar1 = getsockopt((this->super_stream_connecter_base_t)._s,1,4,&local_14,&local_18);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    local_14 = *piVar2;
  }
  iVar1 = local_14;
  if (local_14 == 0) {
    local_4 = (this->super_stream_connecter_base_t)._s;
    (this->super_stream_connecter_base_t)._s = -1;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = iVar1;
    piVar2 = __errno_location();
    bVar4 = false;
    if (*piVar2 != 9) {
      piVar2 = __errno_location();
      bVar4 = false;
      if (*piVar2 != 0x5c) {
        piVar2 = __errno_location();
        bVar4 = false;
        if (*piVar2 != 0x58) {
          piVar2 = __errno_location();
          bVar4 = *piVar2 != 0x69;
        }
      }
    }
    if (!bVar4) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_connecter.cpp"
              ,0x122);
      fflush(_stderr);
      zmq_abort((char *)0x23d26e);
    }
    local_4 = -1;
  }
  return local_4;
}

Assistant:

zmq::fd_t zmq::tcp_connecter_t::connect ()
{
    //  Async connect has finished. Check whether an error occurred
    int err = 0;
#if defined ZMQ_HAVE_HPUX || defined ZMQ_HAVE_VXWORKS
    int len = sizeof err;
#else
    socklen_t len = sizeof err;
#endif

    const int rc = getsockopt (_s, SOL_SOCKET, SO_ERROR,
                               reinterpret_cast<char *> (&err), &len);

    //  Assert if the error was caused by 0MQ bug.
    //  Networking problems are OK. No need to assert.
#ifdef ZMQ_HAVE_WINDOWS
    zmq_assert (rc == 0);
    if (err != 0) {
        if (err == WSAEBADF || err == WSAENOPROTOOPT || err == WSAENOTSOCK
            || err == WSAENOBUFS) {
            wsa_assert_no (err);
        }
        errno = wsa_error_to_errno (err);
        return retired_fd;
    }
#else
    //  Following code should handle both Berkeley-derived socket
    //  implementations and Solaris.
    if (rc == -1)
        err = errno;
    if (err != 0) {
        errno = err;
#if !defined(TARGET_OS_IPHONE) || !TARGET_OS_IPHONE
        errno_assert (errno != EBADF && errno != ENOPROTOOPT
                      && errno != ENOTSOCK && errno != ENOBUFS);
#else
        errno_assert (errno != ENOPROTOOPT && errno != ENOTSOCK
                      && errno != ENOBUFS);
#endif
        return retired_fd;
    }
#endif

    //  Return the newly connected socket.
    const fd_t result = _s;
    _s = retired_fd;
    return result;
}